

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decSetSubnormal(decNumber *dn,decContext *set,int32_t *residue,uint32_t *status)

{
  uint8_t *lsu;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  decContext workset;
  
  iVar8 = (set->emin - set->digits) + 1;
  if (((dn->lsu[0] == '\0') && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)) {
    if (iVar8 <= dn->exponent) {
      return;
    }
    dn->exponent = iVar8;
  }
  else {
    uVar6 = *status;
    *status = uVar6 | 0x1000;
    iVar7 = iVar8 - dn->exponent;
    if (iVar7 == 0 || iVar8 < dn->exponent) {
      if ((uVar6 & 0x20) == 0) {
        return;
      }
      uVar6 = uVar6 | 0x3000;
      goto LAB_0024b040;
    }
    lsu = dn->lsu;
    uVar1 = set->emax;
    uVar2 = set->emin;
    uVar3 = set->round;
    uVar4 = set->traps;
    workset.status = set->status;
    workset.clamp = set->clamp;
    workset._25_3_ = *(undefined3 *)&set->field_0x19;
    workset.emax = uVar1;
    workset.digits = dn->digits - iVar7;
    workset.emin = uVar2 - iVar7;
    workset.round = uVar3;
    workset.traps = uVar4;
    decSetCoeff(dn,&workset,lsu,dn->digits,residue,status);
    decApplyRound(dn,&workset,*residue,status);
    if ((*status & 0x20) != 0) {
      *status = *status | 0x2000;
    }
    if (iVar8 < dn->exponent) {
      iVar5 = decShiftToMost(lsu,dn->digits,1);
      dn->digits = iVar5;
      dn->exponent = dn->exponent + -1;
    }
    if (*lsu != '\0') {
      return;
    }
    if (dn->digits != 1) {
      return;
    }
    if ((dn->bits & 0x70) != 0) {
      return;
    }
  }
  uVar6 = *status | 0x400;
LAB_0024b040:
  *status = uVar6;
  return;
}

Assistant:

static void decSetSubnormal(decNumber *dn, decContext *set, Int *residue,
                            uInt *status) {
  decContext workset;         /* work  */
  Int        etiny, adjust;   /* ..  */

  #if DECSUBSET
  /* simple set to zero and 'hard underflow' for subset  */
  if (!set->extended) {
    uprv_decNumberZero(dn);
    /* always full overflow  */
    *status|=DEC_Underflow | DEC_Subnormal | DEC_Inexact | DEC_Rounded;
    return;
    }
  #endif

  /* Full arithmetic -- allow subnormals, rounded to minimum exponent  */
  /* (Etiny) if needed  */
  etiny=set->emin-(set->digits-1);      /* smallest allowed exponent  */

  if ISZERO(dn) {                       /* value is zero  */
    /* residue can never be non-zero here  */
    #if DECCHECK
      if (*residue!=0) {
        printf("++ Subnormal 0 residue %ld\n", (LI)*residue);
        *status|=DEC_Invalid_operation;
        }
    #endif
    if (dn->exponent<etiny) {           /* clamp required  */
      dn->exponent=etiny;
      *status|=DEC_Clamped;
      }
    return;
    }

  *status|=DEC_Subnormal;               /* have a non-zero subnormal  */
  adjust=etiny-dn->exponent;            /* calculate digits to remove  */
  if (adjust<=0) {                      /* not out of range; unrounded  */
    /* residue can never be non-zero here, except in the Nmin-residue  */
    /* case (which is a subnormal result), so can take fast-path here  */
    /* it may already be inexact (from setting the coefficient)  */
    if (*status&DEC_Inexact) *status|=DEC_Underflow;
    return;
    }

  /* adjust>0, so need to rescale the result so exponent becomes Etiny  */
  /* [this code is similar to that in rescale]  */
  workset=*set;                         /* clone rounding, etc.  */
  workset.digits=dn->digits-adjust;     /* set requested length  */
  workset.emin-=adjust;                 /* and adjust emin to match  */
  /* [note that the latter can be <1, here, similar to Rescale case]  */
  decSetCoeff(dn, &workset, dn->lsu, dn->digits, residue, status);
  decApplyRound(dn, &workset, *residue, status);

  /* Use 754 default rule: Underflow is set iff Inexact  */
  /* [independent of whether trapped]  */
  if (*status&DEC_Inexact) *status|=DEC_Underflow;

  /* if rounded up a 999s case, exponent will be off by one; adjust  */
  /* back if so [it will fit, because it was shortened earlier]  */
  if (dn->exponent>etiny) {
    dn->digits=decShiftToMost(dn->lsu, dn->digits, 1);
    dn->exponent--;                     /* (re)adjust the exponent.  */
    }

  /* if rounded to zero, it is by definition clamped...  */
  if (ISZERO(dn)) *status|=DEC_Clamped;
  }